

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxLoopStatement::Resolve(FxLoopStatement *this,FCompileContext *ctx)

{
  _func_int **pp_Var1;
  FxExpression *pFVar2;
  FxLoopStatement *pFVar3;
  int iVar4;
  undefined4 extraout_var;
  
  pp_Var1 = (this->super_FxExpression)._vptr_FxExpression;
  pFVar2 = ctx->ControlStmt;
  pFVar3 = ctx->Loop;
  ctx->ControlStmt = &this->super_FxExpression;
  ctx->Loop = this;
  iVar4 = (*pp_Var1[0xb])();
  ctx->ControlStmt = pFVar2;
  ctx->Loop = pFVar3;
  return (FxExpression *)CONCAT44(extraout_var,iVar4);
}

Assistant:

FxExpression *FxLoopStatement::Resolve(FCompileContext &ctx)
{
	auto outerctrl = ctx.ControlStmt;
	auto outer = ctx.Loop;
	ctx.ControlStmt = this;
	ctx.Loop = this;
	auto x = DoResolve(ctx);
	ctx.Loop = outer;
	ctx.ControlStmt = outerctrl;
	return x;
}